

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O0

void __thiscall
IRBuilder::BuildElementScopedC
          (IRBuilder *this,OpCode newOpcode,uint32 offset,RegSlot regSlot,
          PropertyIdIndexType propertyIdIndex)

{
  code *pcVar1;
  bool bVar2;
  PropertyId propertyId_00;
  RegSlot reg;
  int iVar3;
  int iVar4;
  JITTimeFunctionBody *this_00;
  SymOpnd *dstOpnd;
  ScriptContextInfo *pSVar5;
  undefined4 extraout_var;
  Func *this_01;
  undefined4 extraout_var_00;
  RegOpnd *pRVar6;
  RegOpnd *src1Opnd;
  undefined4 *puVar7;
  Opnd *instance2Opnd;
  SymOpnd *fieldSymOpnd;
  RegSlot fieldRegSlot;
  RegOpnd *regOpnd;
  PropertyKind propertyKind;
  Instr *pIStack_28;
  PropertyId propertyId;
  Instr *instr;
  PropertyIdIndexType propertyIdIndex_local;
  RegSlot regSlot_local;
  uint32 offset_local;
  OpCode newOpcode_local;
  IRBuilder *this_local;
  
  this_00 = Func::GetJITFunctionBody(this->m_func);
  propertyId_00 = JITTimeFunctionBody::GetReferencedPropertyId(this_00,propertyIdIndex);
  reg = GetEnvRegForEvalCode(this);
  dstOpnd = BuildFieldOpnd(this,newOpcode,reg,propertyId_00,propertyIdIndex,PropertyKindData,
                           0xffffffff);
  if (newOpcode == ScopedEnsureNoRedeclFld) {
    pRVar6 = BuildSrcOpnd(this,regSlot,TyVar);
    pIStack_28 = IR::Instr::New(ScopedEnsureNoRedeclFld,&dstOpnd->super_Opnd,&pRVar6->super_Opnd,
                                this->m_func);
  }
  else if (newOpcode == ScopedInitFunc) {
    pRVar6 = BuildSrcOpnd(this,1,TyVar);
    src1Opnd = BuildSrcOpnd(this,regSlot,TyVar);
    pIStack_28 = IR::Instr::New(ScopedInitFunc,&dstOpnd->super_Opnd,&src1Opnd->super_Opnd,
                                &pRVar6->super_Opnd,this->m_func);
  }
  else {
    if (1 < (ushort)(newOpcode - ScopedDeleteFld)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                         ,0xce1,"((0))","Unknown ElementScopedC opcode");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
      Js::Throw::FatalInternalError(-0x7fffbffb);
    }
    pSVar5 = Func::GetScriptContextInfo(this->m_func);
    iVar3 = (*pSVar5->_vptr_ScriptContextInfo[0x20])();
    this_01 = Func::GetTopFunc(this->m_func);
    pSVar5 = Func::GetScriptContextInfo(this_01);
    iVar4 = (*pSVar5->_vptr_ScriptContextInfo[0x20])();
    if (CONCAT44(extraout_var,iVar3) != CONCAT44(extraout_var_00,iVar4)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                         ,0xcd1,
                         "(this->m_func->GetScriptContextInfo()->GetAddr() == this->m_func->GetTopFunc()->GetScriptContextInfo()->GetAddr())"
                         ,
                         "this->m_func->GetScriptContextInfo()->GetAddr() == this->m_func->GetTopFunc()->GetScriptContextInfo()->GetAddr()"
                        );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    pRVar6 = BuildDstOpnd(this,regSlot,TyVar,false,false);
    pIStack_28 = IR::Instr::New(newOpcode,&pRVar6->super_Opnd,&dstOpnd->super_Opnd,this->m_func);
  }
  AddInstr(this,pIStack_28,offset);
  return;
}

Assistant:

void
IRBuilder::BuildElementScopedC(Js::OpCode newOpcode, uint32 offset, Js::RegSlot regSlot, Js::PropertyIdIndexType propertyIdIndex)
{
    IR::Instr *     instr;
    Js::PropertyId  propertyId = m_func->GetJITFunctionBody()->GetReferencedPropertyId(propertyIdIndex);
    PropertyKind    propertyKind = PropertyKindData;
    IR::RegOpnd * regOpnd;
    Js::RegSlot     fieldRegSlot = this->GetEnvRegForEvalCode();
    IR::SymOpnd *   fieldSymOpnd = this->BuildFieldOpnd(newOpcode, fieldRegSlot, propertyId, propertyIdIndex, propertyKind);

    switch (newOpcode)
    {
    case Js::OpCode::ScopedEnsureNoRedeclFld:
    {
        regOpnd = this->BuildSrcOpnd(regSlot);
        instr = IR::Instr::New(newOpcode, fieldSymOpnd, regOpnd, m_func);
        break;
    }

    case Js::OpCode::ScopedDeleteFld:
    case Js::OpCode::ScopedDeleteFldStrict:
    {
        Assert(this->m_func->GetScriptContextInfo()->GetAddr() == this->m_func->GetTopFunc()->GetScriptContextInfo()->GetAddr());
        regOpnd = this->BuildDstOpnd(regSlot);
        instr = IR::Instr::New(newOpcode, regOpnd, fieldSymOpnd, m_func);
        break;
    }

    case Js::OpCode::ScopedInitFunc:
    {
        // Implicit root object as default instance
        IR::Opnd * instance2Opnd = this->BuildSrcOpnd(Js::FunctionBody::RootObjectRegSlot);
        regOpnd = this->BuildSrcOpnd(regSlot);
        instr = IR::Instr::New(newOpcode, fieldSymOpnd, regOpnd, instance2Opnd, m_func);
        break;
    }

    default:
        AssertMsg(UNREACHED, "Unknown ElementScopedC opcode");
        Fatal();
    }

    this->AddInstr(instr, offset);
}